

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filepath.cpp
# Opt level: O0

string * directoryOf(string *filename)

{
  uint uVar1;
  char *pcVar2;
  string *in_RSI;
  string *in_RDI;
  bool bVar3;
  
  while( true ) {
    uVar1 = std::__cxx11::string::empty();
    bVar3 = false;
    if ((uVar1 & 1) == 0) {
      pcVar2 = (char *)std::__cxx11::string::back();
      bVar3 = false;
      if (*pcVar2 != '\\') {
        pcVar2 = (char *)std::__cxx11::string::back();
        bVar3 = *pcVar2 != '/';
      }
    }
    if (!bVar3) break;
    std::__cxx11::string::pop_back();
  }
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

std::string directoryOf(std::string filename) {
	while (!filename.empty() && filename.back()!='\\' && filename.back()!='/')
		filename.pop_back();
	return filename;
}